

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-base.h
# Opt level: O0

void __thiscall dynamicgraph::SignalBase<int>::trace(SignalBase<int> *this,ostream *param_1)

{
  ExceptionSignal *this_00;
  string *psVar1;
  undefined8 uVar2;
  undefined8 in_R9;
  allocator<char> local_41;
  string local_40 [36];
  ErrorCodeEnum local_1c;
  ostream *local_18;
  ostream *param_1_local;
  SignalBase<int> *this_local;
  
  local_18 = param_1;
  param_1_local = (ostream *)this;
  this_00 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
  local_1c = SET_IMPOSSIBLE;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,"Trace operation not possible with this signal. ",&local_41);
  psVar1 = getName_abi_cxx11_(this);
  uVar2 = std::__cxx11::string::c_str();
  dynamicgraph::ExceptionSignal::ExceptionSignal
            (this_00,&local_1c,local_40,"(while trying to trace %s).",uVar2,in_R9,psVar1);
  __cxa_throw(this_00,&ExceptionSignal::typeinfo,ExceptionSignal::~ExceptionSignal);
}

Assistant:

virtual void trace(std::ostream &) const {
    DG_THROW ExceptionSignal(ExceptionSignal::SET_IMPOSSIBLE,
                             "Trace operation not possible with this signal. ",
                             "(while trying to trace %s).",
                             this->getName().c_str());
  }